

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetNestedMessageName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Descriptor *descriptor)

{
  long *plVar1;
  string *psVar2;
  int iVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *psVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this == (_anonymous_namespace_ *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return extraout_RAX_01;
  }
  plVar1 = *(long **)(this + 8);
  psVar5 = (string *)plVar1[1];
  psVar2 = *(string **)(*(long *)(*(long *)(this + 0x10) + 8) + 8);
  if (psVar2 <= psVar5) {
    iVar3 = std::__cxx11::string::compare((ulong)plVar1,0,psVar2);
    if (iVar3 == 0) {
      psVar4 = (string *)std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)plVar1);
      goto LAB_0022a85c;
    }
    psVar5 = (string *)plVar1[1];
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*plVar1,psVar5 + *plVar1);
  psVar4 = extraout_RAX;
LAB_0022a85c:
  if ((__return_storage_ptr__->_M_string_length != 0) &&
     (psVar4 = (string *)(__return_storage_ptr__->_M_dataplus)._M_p,
     *(char *)&(psVar4->_M_dataplus)._M_p != '.')) {
    std::operator+(&local_38,".",__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
    psVar4 = (string *)&local_38.field_2;
    if ((string *)local_38._M_dataplus._M_p != psVar4) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      psVar4 = extraout_RAX_00;
    }
  }
  return psVar4;
}

Assistant:

string GetNestedMessageName(const Descriptor* descriptor) {
  if (descriptor == NULL) {
    return "";
  }
  string result =
      StripPrefixString(descriptor->full_name(), descriptor->file()->package());
  // Add a leading dot if one is not already present.
  if (!result.empty() && result[0] != '.') {
    result = "." + result;
  }
  return result;
}